

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDFace::MarkedVertexCount(ON_SubDFace *this)

{
  long lVar1;
  bool bVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  ushort uVar6;
  ON_SubDEdgePtr *pOVar7;
  
  uVar3 = this->m_edge_count;
  if (uVar3 == 0) {
    uVar5 = 0;
  }
  else {
    pOVar7 = this->m_edge4;
    uVar5 = 0;
    uVar6 = 0;
    do {
      if ((uVar6 == 4) && (pOVar7 = this->m_edgex, pOVar7 == (ON_SubDEdgePtr *)0x0)) {
        return uVar5;
      }
      uVar4 = pOVar7->m_ptr & 0xfffffffffffffff8;
      if ((uVar4 != 0) &&
         (lVar1 = *(long *)(uVar4 + 0x80 + (ulong)((uint)pOVar7->m_ptr & 1) * 8), lVar1 != 0)) {
        bVar2 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar1 + 0x10));
        uVar5 = uVar5 + bVar2;
        uVar3 = this->m_edge_count;
      }
      uVar6 = uVar6 + 1;
      pOVar7 = pOVar7 + 1;
    } while (uVar6 < uVar3);
  }
  return uVar5;
}

Assistant:

unsigned int ON_SubDFace::MarkedVertexCount() const
{
  unsigned int marked_vertex_count = 0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++ eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDVertex* v = eptr->RelativeVertex(0);
    if (nullptr != v && v->m_status.RuntimeMark())
      ++marked_vertex_count;
  }
  return marked_vertex_count;
}